

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O1

void __thiscall EmitXml::spaces(EmitXml *this,int4 num,int4 bump)

{
  string spc;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if (num < 0xb) {
    (*this->_vptr_EmitXml[0x19])(this,"          " + (10 - num),8);
    return;
  }
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  do {
    std::__cxx11::string::push_back((char)&local_40);
    num = num + -1;
  } while (num != 0);
  (*this->_vptr_EmitXml[0x19])(this,local_40,8);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

void EmitXml::spaces(int4 num,int4 bump)

{
  const char *tenspaces = "          ";
  if (num <= 10)
    print(tenspaces+(10-num));
  else {
    string spc;
    for(int4 i=0;i<num;++i)
      spc += ' ';
    print(spc.c_str());
  }
}